

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# city.cc
# Opt level: O2

uint64_t absl::lts_20250127::hash_internal::CityHash64(char *s,size_t len)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  char *s_00;
  long lVar10;
  pair<unsigned_long,_unsigned_long> pVar11;
  pair<unsigned_long,_unsigned_long> pVar12;
  unsigned_long local_40;
  
  if (len < 0x21) {
    if (len < 0x11) {
      if (len < 8) {
        if (len < 4) {
          if (len == 0) {
            return 0x9ae16a3b2f90404f;
          }
          uVar6 = ((ulong)(byte)s[len - 1] << 2 | len) * -0x3c5a37a36834ced9 ^
                  (ulong)CONCAT11(s[len >> 1],*s) * -0x651e95c4d06fbfb1;
          return (uVar6 >> 0x2f ^ uVar6) * -0x651e95c4d06fbfb1;
        }
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar6 = ((ulong)*(uint *)s * 8 + len ^ (ulong)*(uint *)(s + (len - 4))) * lVar5;
        uVar6 = (uVar6 >> 0x2f ^ *(uint *)(s + (len - 4)) ^ uVar6) * lVar5;
        uVar6 = uVar6 >> 0x2f ^ uVar6;
      }
      else {
        lVar5 = len * 2 + -0x651e95c4d06fbfb1;
        uVar1 = *(long *)s + 0x9ae16a3b2f90404f;
        uVar6 = *(ulong *)(s + (len - 8));
        uVar2 = ((uVar1 << 0x27 | uVar1 >> 0x19) + uVar6) * lVar5;
        uVar6 = ((uVar6 << 0x1b | uVar6 >> 0x25) * lVar5 + uVar1 ^ uVar2) * lVar5;
        uVar6 = (uVar6 >> 0x2f ^ uVar2 ^ uVar6) * lVar5;
        uVar6 = uVar6 >> 0x2f ^ uVar6;
      }
    }
    else {
      lVar5 = len * 2 + -0x651e95c4d06fbfb1;
      uVar2 = *(long *)(s + (len - 8)) * lVar5;
      uVar6 = *(long *)s * -0x4b6d499041670d8d + *(long *)(s + 8);
      uVar1 = *(long *)(s + 8) + 0x9ae16a3b2f90404f;
      uVar1 = (uVar1 << 0x2e | uVar1 >> 0x12) + *(long *)s * -0x4b6d499041670d8d + uVar2;
      uVar6 = ((uVar2 << 0x22 | uVar2 >> 0x1e) + (uVar6 * 0x200000 | uVar6 >> 0x2b) +
               *(long *)(s + (len - 0x10)) * -0x651e95c4d06fbfb1 ^ uVar1) * lVar5;
      uVar6 = (uVar6 >> 0x2f ^ uVar1 ^ uVar6) * lVar5;
      uVar6 = uVar6 >> 0x2f ^ uVar6;
    }
    uVar3 = uVar6 * lVar5;
  }
  else {
    if (0x40 < len) {
      uVar6 = *(long *)(s + (len - 0x38)) + *(long *)(s + (len - 0x10));
      uVar3 = *(uint64_t *)(s + (len - 0x28));
      uVar4 = HashLen16(*(long *)(s + (len - 0x30)) + len,*(uint64_t *)(s + (len - 0x18)));
      pVar11 = WeakHashLen32WithSeeds(s + (len - 0x40),len,uVar4);
      pVar12 = WeakHashLen32WithSeeds(s + (len - 0x20),uVar6 + 0xb492b66fbe98f273,uVar3);
      lVar10 = uVar3 * -0x4b6d499041670d8d + *(long *)s;
      s_00 = s + 0x20;
      lVar5 = -(len - 1 & 0xffffffffffffffc0);
      do {
        local_40 = pVar11.second;
        uVar1 = lVar10 + pVar11.first + uVar6 + *(long *)(s_00 + -0x18);
        uVar6 = uVar6 + local_40 + *(long *)(s_00 + 0x10);
        uVar2 = (uVar1 * 0x8000000 | uVar1 >> 0x25) * -0x4b6d499041670d8d ^ pVar12.second;
        uVar6 = pVar11.first + *(long *)(s_00 + 8) +
                (uVar6 * 0x400000 | uVar6 >> 0x2a) * -0x4b6d499041670d8d;
        uVar1 = uVar4 + pVar12.first;
        lVar10 = (uVar1 * 0x80000000 | uVar1 >> 0x21) * -0x4b6d499041670d8d;
        pVar11 = WeakHashLen32WithSeeds
                           (s_00 + -0x20,local_40 * -0x4b6d499041670d8d,pVar12.first + uVar2);
        pVar12 = WeakHashLen32WithSeeds(s_00,pVar12.second + lVar10,*(long *)(s_00 + -0x10) + uVar6)
        ;
        s_00 = s_00 + 0x40;
        lVar5 = lVar5 + 0x40;
        uVar4 = uVar2;
      } while (lVar5 != 0);
      uVar3 = HashLen16(pVar11.first,pVar12.first);
      uVar4 = HashLen16(pVar11.second,pVar12.second);
      uVar3 = HashLen16((uVar6 >> 0x2f ^ uVar6) * -0x4b6d499041670d8d + uVar2 + uVar3,lVar10 + uVar4
                       );
      return uVar3;
    }
    lVar5 = len * 2 + -0x651e95c4d06fbfb1;
    uVar6 = *(ulong *)(s + 8);
    lVar8 = *(long *)(s + 0x18) * 9;
    lVar10 = *(long *)(s + (len - 0x18));
    uVar2 = *(long *)s * -0x651e95c4d06fbfb1 + *(long *)(s + (len - 8));
    uVar1 = *(long *)(s + 0x10) * -0x651e95c4d06fbfb1 + lVar8;
    uVar7 = uVar2 ^ *(ulong *)(s + (len - 0x20));
    uVar2 = (uVar7 + lVar8 + 1 +
            ((uVar6 << 0x22 | uVar6 >> 0x1e) + lVar10) * 9 + (uVar2 * 0x200000 | uVar2 >> 0x2b)) *
            lVar5;
    lVar9 = (uVar1 * 0x400000 | uVar1 >> 0x2a) + lVar10;
    uVar2 = (*(long *)(s + (len - 0x10)) * lVar5 + lVar8 + uVar7 + 1 +
            (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar5;
    uVar2 = (*(long *)(s + (len - 8)) + uVar1 + lVar10 + lVar9 +
            (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar5;
    uVar6 = *(long *)(s + (len - 0x10)) * lVar5 + *(ulong *)(s + (len - 0x20)) +
            (uVar1 + lVar10 + uVar6 +
            (uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
             (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
             (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38)) * lVar5;
    uVar3 = (uVar6 >> 0x2f ^ uVar6) * lVar5 + lVar9;
  }
  return uVar3;
}

Assistant:

uint64_t CityHash64(const char *s, size_t len) {
  if (len <= 32) {
    if (len <= 16) {
      return HashLen0to16(s, len);
    } else {
      return HashLen17to32(s, len);
    }
  } else if (len <= 64) {
    return HashLen33to64(s, len);
  }

  // For strings over 64 bytes we hash the end first, and then as we
  // loop we keep 56 bytes of state: v, w, x, y, and z.
  uint64_t x = Fetch64(s + len - 40);
  uint64_t y = Fetch64(s + len - 16) + Fetch64(s + len - 56);
  uint64_t z = HashLen16(Fetch64(s + len - 48) + len, Fetch64(s + len - 24));
  std::pair<uint64_t, uint64_t> v =
      WeakHashLen32WithSeeds(s + len - 64, len, z);
  std::pair<uint64_t, uint64_t> w =
      WeakHashLen32WithSeeds(s + len - 32, y + k1, x);
  x = x * k1 + Fetch64(s);

  // Decrease len to the nearest multiple of 64, and operate on 64-byte chunks.
  len = (len - 1) & ~static_cast<size_t>(63);
  do {
    x = Rotate(x + y + v.first + Fetch64(s + 8), 37) * k1;
    y = Rotate(y + v.second + Fetch64(s + 48), 42) * k1;
    x ^= w.second;
    y += v.first + Fetch64(s + 40);
    z = Rotate(z + w.first, 33) * k1;
    v = WeakHashLen32WithSeeds(s, v.second * k1, x + w.first);
    w = WeakHashLen32WithSeeds(s + 32, z + w.second, y + Fetch64(s + 16));
    std::swap(z, x);
    s += 64;
    len -= 64;
  } while (len != 0);
  return HashLen16(HashLen16(v.first, w.first) + ShiftMix(y) * k1 + z,
                   HashLen16(v.second, w.second) + x);
}